

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3FindInIndex(Parse *pParse,Expr *pX,u32 inFlags,int *prRhsHasNull,int *aiMap,int *piTab)

{
  ExprList *pEVar1;
  Table *pTab_00;
  Expr *pEVar2;
  bool bVar3;
  uint uVar4;
  char cVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  Vdbe *pExpr;
  Select *pSVar9;
  CollSeq *pCVar10;
  ulong uVar11;
  int *in_RCX;
  uint in_EDX;
  Expr *in_RSI;
  Parse *in_RDI;
  long in_R8;
  int *in_R9;
  int n;
  int i_2;
  int rMayHaveNull;
  u32 savedNQueryLoop;
  int iAddr_1;
  int j;
  CollSeq *pReq;
  Expr *pRhs;
  Expr *pLhs_1;
  Bitmask mCol;
  Bitmask colUsed;
  char cmpaff;
  char idxaff;
  int iCol;
  Expr *pLhs;
  int i_1;
  int affinity_ok;
  Index *pIdx;
  int iAddr;
  int nExpr;
  ExprList *pEList_1;
  int iDb;
  Table *pTab;
  sqlite3 *db;
  ExprList *pEList;
  int i;
  Vdbe *v;
  int mustBeUnique;
  int iTab;
  int eType;
  Select *p;
  int in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  Pgno in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  int iVar12;
  int in_stack_ffffffffffffff20;
  LogEst LVar13;
  int in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  Parse *in_stack_ffffffffffffff30;
  ulong local_b0;
  int local_98;
  Index *local_90;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb8;
  int local_40;
  int local_3c;
  int *local_20;
  
  local_3c = 0;
  pExpr = sqlite3GetVdbe((Parse *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  uVar7 = (uint)((in_EDX & 4) != 0);
  local_40 = in_RDI->nTab;
  in_RDI->nTab = local_40 + 1;
  local_20 = in_RCX;
  if ((in_RCX != (int *)0x0) && ((in_RSI->flags & 0x1000) != 0)) {
    pEVar1 = ((in_RSI->x).pSelect)->pEList;
    in_stack_ffffffffffffffac = 0;
    while ((in_stack_ffffffffffffffac < pEVar1->nExpr &&
           (iVar8 = sqlite3ExprCanBeNull(pEVar1->a[in_stack_ffffffffffffffac].pExpr), iVar8 == 0)))
    {
      in_stack_ffffffffffffffac = in_stack_ffffffffffffffac + 1;
    }
    if (in_stack_ffffffffffffffac == pEVar1->nExpr) {
      local_20 = (int *)0x0;
    }
  }
  if ((in_RDI->nErr == 0) && (pSVar9 = isCandidateForInOpt(in_RSI), pSVar9 != (Select *)0x0)) {
    pEVar1 = pSVar9->pEList;
    iVar8 = pEVar1->nExpr;
    pTab_00 = pSVar9->pSrc->a[0].pSTab;
    sqlite3SchemaToIndex(in_RDI->db,pTab_00->pSchema);
    sqlite3CodeVerifySchema
              ((Parse *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff0c);
    sqlite3TableLock((Parse *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
                     (u8)(in_stack_ffffffffffffff14 >> 0x18),
                     (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    if ((iVar8 == 1) && ((pEVar1->a[0].pExpr)->iColumn < 0)) {
      sqlite3VdbeAddOp0((Vdbe *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        in_stack_ffffffffffffff0c);
      sqlite3OpenTable(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28
                       ,(Table *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       in_stack_ffffffffffffff1c);
      local_3c = 1;
      sqlite3VdbeExplain(in_RDI,'\0',"USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR",pTab_00->zName
                        );
      sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          in_stack_ffffffffffffff0c);
    }
    else {
      bVar3 = true;
      local_98 = 0;
      while( true ) {
        uVar4 = in_stack_ffffffffffffff14 & 0xffffff;
        if (local_98 < iVar8) {
          uVar4 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffff14);
        }
        in_stack_ffffffffffffff14 = uVar4;
        if ((char)(in_stack_ffffffffffffff14 >> 0x18) == '\0') break;
        sqlite3VectorFieldSubexpr
                  ((Expr *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0);
        cVar5 = sqlite3TableColumnAffinity(pTab_00,(int)(pEVar1->a[local_98].pExpr)->iColumn);
        cVar6 = sqlite3CompareAffinity
                          ((Expr *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                           '\0');
        in_stack_ffffffffffffff10 = (int)cVar6;
        if ((in_stack_ffffffffffffff10 != 0x41) && (in_stack_ffffffffffffff10 != 0x42)) {
          bVar3 = 'B' < cVar5;
        }
        local_98 = local_98 + 1;
      }
      if (bVar3) {
        local_90 = pTab_00->pIndex;
        while( true ) {
          uVar4 = in_stack_ffffffffffffff0c & 0xffffff;
          if (local_90 != (Index *)0x0) {
            uVar4 = CONCAT13(local_3c == 0,(int3)in_stack_ffffffffffffff0c);
          }
          in_stack_ffffffffffffff0c = uVar4;
          if ((char)(in_stack_ffffffffffffff0c >> 0x18) == '\0') break;
          if ((((iVar8 <= (int)(uint)local_90->nColumn) && (local_90->pPartIdxWhere == (Expr *)0x0))
              && (local_90->nColumn < 0x3f)) &&
             ((uVar7 == 0 ||
              (((int)(uint)local_90->nKeyCol <= iVar8 &&
               (((int)(uint)local_90->nColumn <= iVar8 || (local_90->onError != '\0')))))))) {
            local_b0 = 0;
            for (local_98 = 0; local_98 < iVar8; local_98 = local_98 + 1) {
              sqlite3VectorFieldSubexpr
                        ((Expr *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0);
              pEVar2 = pEVar1->a[local_98].pExpr;
              pCVar10 = sqlite3BinaryCompareCollSeq
                                  ((Parse *)CONCAT44(in_stack_ffffffffffffff24,
                                                     in_stack_ffffffffffffff20),
                                   (Expr *)CONCAT44(in_stack_ffffffffffffff1c,
                                                    in_stack_ffffffffffffff18),
                                   (Expr *)CONCAT44(in_stack_ffffffffffffff14,
                                                    in_stack_ffffffffffffff10));
              in_stack_ffffffffffffff2c = 0;
              while ((in_stack_ffffffffffffff2c < iVar8 &&
                     ((local_90->aiColumn[in_stack_ffffffffffffff2c] != pEVar2->iColumn ||
                      ((pCVar10 != (CollSeq *)0x0 &&
                       (iVar12 = sqlite3StrICmp(pCVar10->zName,
                                                local_90->azColl[in_stack_ffffffffffffff2c]),
                       iVar12 != 0))))))) {
                in_stack_ffffffffffffff2c = in_stack_ffffffffffffff2c + 1;
              }
              if ((in_stack_ffffffffffffff2c == iVar8) ||
                 (uVar11 = 1L << ((byte)in_stack_ffffffffffffff2c & 0x3f), (uVar11 & local_b0) != 0)
                 ) break;
              local_b0 = uVar11 | local_b0;
              if (in_R8 != 0) {
                *(int *)(in_R8 + (long)local_98 * 4) = in_stack_ffffffffffffff2c;
              }
            }
            if (local_b0 == (1L << ((byte)iVar8 & 0x3f)) - 1U) {
              iVar12 = sqlite3VdbeAddOp0((Vdbe *)CONCAT44(in_stack_ffffffffffffff14,
                                                          in_stack_ffffffffffffff10),
                                         in_stack_ffffffffffffff0c);
              sqlite3VdbeExplain(in_RDI,'\0',"USING INDEX %s FOR IN-OPERATOR",local_90->zName);
              sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff2c,iVar12),
                                in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,
                                in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
              sqlite3VdbeSetP4KeyInfo
                        ((Parse *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         (Index *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
              local_3c = *local_90->aSortOrder + 3;
              if (local_20 != (int *)0x0) {
                iVar12 = in_RDI->nMem + 1;
                in_RDI->nMem = iVar12;
                *local_20 = iVar12;
                if (iVar8 == 1) {
                  sqlite3SetHasNullFlag
                            ((Vdbe *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                             in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
                }
              }
              sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff14,
                                                   in_stack_ffffffffffffff10),
                                  in_stack_ffffffffffffff0c);
            }
          }
          local_90 = local_90->pNext;
        }
      }
    }
  }
  if ((((local_3c == 0) && ((in_EDX & 1) != 0)) && ((in_RSI->flags & 0x1000) == 0)) &&
     ((iVar8 = sqlite3InRhsIsConstant
                         ((Parse *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                          (Expr *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)),
      iVar8 == 0 || (((in_RSI->x).pList)->nExpr < 3)))) {
    in_RDI->nTab = in_RDI->nTab + -1;
    local_40 = -1;
    local_3c = 5;
  }
  if (local_3c == 0) {
    LVar13 = in_RDI->nQueryLoop;
    iVar8 = 0;
    local_3c = 2;
    if ((in_EDX & 4) == 0) {
      if (local_20 != (int *)0x0) {
        iVar8 = in_RDI->nMem + 1;
        in_RDI->nMem = iVar8;
        *local_20 = iVar8;
      }
    }
    else {
      in_RDI->nQueryLoop = 0;
    }
    sqlite3CodeRhsOfIN((Parse *)CONCAT44(uVar7,in_stack_ffffffffffffffb8),(Expr *)pExpr,
                       in_stack_ffffffffffffffac);
    if (iVar8 != 0) {
      sqlite3SetHasNullFlag
                ((Vdbe *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
    }
    in_RDI->nQueryLoop = LVar13;
  }
  if (((in_R8 != 0) && (local_3c != 3)) && (local_3c != 4)) {
    iVar8 = sqlite3ExprVectorSize(in_RSI->pLeft);
    for (iVar12 = 0; iVar12 < iVar8; iVar12 = iVar12 + 1) {
      *(int *)(in_R8 + (long)iVar12 * 4) = iVar12;
    }
  }
  *in_R9 = local_40;
  return local_3c;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindInIndex(
  Parse *pParse,             /* Parsing context */
  Expr *pX,                  /* The IN expression */
  u32 inFlags,               /* IN_INDEX_LOOP, _MEMBERSHIP, and/or _NOOP_OK */
  int *prRhsHasNull,         /* Register holding NULL status.  See notes */
  int *aiMap,                /* Mapping from Index fields to RHS fields */
  int *piTab                 /* OUT: index to use */
){
  Select *p;                            /* SELECT to the right of IN operator */
  int eType = 0;                        /* Type of RHS table. IN_INDEX_* */
  int iTab;                             /* Cursor of the RHS table */
  int mustBeUnique;                     /* True if RHS must be unique */
  Vdbe *v = sqlite3GetVdbe(pParse);     /* Virtual machine being coded */

  assert( pX->op==TK_IN );
  mustBeUnique = (inFlags & IN_INDEX_LOOP)!=0;
  iTab = pParse->nTab++;

  /* If the RHS of this IN(...) operator is a SELECT, and if it matters
  ** whether or not the SELECT result contains NULL values, check whether
  ** or not NULL is actually possible (it may not be, for example, due
  ** to NOT NULL constraints in the schema). If no NULL values are possible,
  ** set prRhsHasNull to 0 before continuing.  */
  if( prRhsHasNull && ExprUseXSelect(pX) ){
    int i;
    ExprList *pEList = pX->x.pSelect->pEList;
    for(i=0; i<pEList->nExpr; i++){
      if( sqlite3ExprCanBeNull(pEList->a[i].pExpr) ) break;
    }
    if( i==pEList->nExpr ){
      prRhsHasNull = 0;
    }
  }

  /* Check to see if an existing table or index can be used to
  ** satisfy the query.  This is preferable to generating a new
  ** ephemeral table.  */
  if( pParse->nErr==0 && (p = isCandidateForInOpt(pX))!=0 ){
    sqlite3 *db = pParse->db;              /* Database connection */
    Table *pTab;                           /* Table <table>. */
    int iDb;                               /* Database idx for pTab */
    ExprList *pEList = p->pEList;
    int nExpr = pEList->nExpr;

    assert( p->pEList!=0 );             /* Because of isCandidateForInOpt(p) */
    assert( p->pEList->a[0].pExpr!=0 ); /* Because of isCandidateForInOpt(p) */
    assert( p->pSrc!=0 );               /* Because of isCandidateForInOpt(p) */
    pTab = p->pSrc->a[0].pSTab;

    /* Code an OP_Transaction and OP_TableLock for <table>. */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    assert( iDb>=0 && iDb<SQLITE_MAX_DB );
    sqlite3CodeVerifySchema(pParse, iDb);
    sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);

    assert(v);  /* sqlite3GetVdbe() has always been previously called */
    if( nExpr==1 && pEList->a[0].pExpr->iColumn<0 ){
      /* The "x IN (SELECT rowid FROM table)" case */
      int iAddr = sqlite3VdbeAddOp0(v, OP_Once);
      VdbeCoverage(v);

      sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
      eType = IN_INDEX_ROWID;
      ExplainQueryPlan((pParse, 0,
            "USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR",pTab->zName));
      sqlite3VdbeJumpHere(v, iAddr);
    }else{
      Index *pIdx;                         /* Iterator variable */
      int affinity_ok = 1;
      int i;

      /* Check that the affinity that will be used to perform each
      ** comparison is the same as the affinity of each column in table
      ** on the RHS of the IN operator.  If it not, it is not possible to
      ** use any index of the RHS table.  */
      for(i=0; i<nExpr && affinity_ok; i++){
        Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
        int iCol = pEList->a[i].pExpr->iColumn;
        char idxaff = sqlite3TableColumnAffinity(pTab,iCol); /* RHS table */
        char cmpaff = sqlite3CompareAffinity(pLhs, idxaff);
        testcase( cmpaff==SQLITE_AFF_BLOB );
        testcase( cmpaff==SQLITE_AFF_TEXT );
        switch( cmpaff ){
          case SQLITE_AFF_BLOB:
            break;
          case SQLITE_AFF_TEXT:
            /* sqlite3CompareAffinity() only returns TEXT if one side or the
            ** other has no affinity and the other side is TEXT.  Hence,
            ** the only way for cmpaff to be TEXT is for idxaff to be TEXT
            ** and for the term on the LHS of the IN to have no affinity. */
            assert( idxaff==SQLITE_AFF_TEXT );
            break;
          default:
            affinity_ok = sqlite3IsNumericAffinity(idxaff);
        }
      }

      if( affinity_ok ){
        /* Search for an existing index that will work for this IN operator */
        for(pIdx=pTab->pIndex; pIdx && eType==0; pIdx=pIdx->pNext){
          Bitmask colUsed;      /* Columns of the index used */
          Bitmask mCol;         /* Mask for the current column */
          if( pIdx->nColumn<nExpr ) continue;
          if( pIdx->pPartIdxWhere!=0 ) continue;
          /* Maximum nColumn is BMS-2, not BMS-1, so that we can compute
          ** BITMASK(nExpr) without overflowing */
          testcase( pIdx->nColumn==BMS-2 );
          testcase( pIdx->nColumn==BMS-1 );
          if( pIdx->nColumn>=BMS-1 ) continue;
          if( mustBeUnique ){
            if( pIdx->nKeyCol>nExpr
             ||(pIdx->nColumn>nExpr && !IsUniqueIndex(pIdx))
            ){
              continue;  /* This index is not unique over the IN RHS columns */
            }
          }

          colUsed = 0;   /* Columns of index used so far */
          for(i=0; i<nExpr; i++){
            Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
            Expr *pRhs = pEList->a[i].pExpr;
            CollSeq *pReq = sqlite3BinaryCompareCollSeq(pParse, pLhs, pRhs);
            int j;

            for(j=0; j<nExpr; j++){
              if( pIdx->aiColumn[j]!=pRhs->iColumn ) continue;
              assert( pIdx->azColl[j] );
              if( pReq!=0 && sqlite3StrICmp(pReq->zName, pIdx->azColl[j])!=0 ){
                continue;
              }
              break;
            }
            if( j==nExpr ) break;
            mCol = MASKBIT(j);
            if( mCol & colUsed ) break; /* Each column used only once */
            colUsed |= mCol;
            if( aiMap ) aiMap[i] = j;
          }

          assert( nExpr>0 && nExpr<BMS );
          assert( i==nExpr || colUsed!=(MASKBIT(nExpr)-1) );
          if( colUsed==(MASKBIT(nExpr)-1) ){
            /* If we reach this point, that means the index pIdx is usable */
            int iAddr = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
            ExplainQueryPlan((pParse, 0,
                              "USING INDEX %s FOR IN-OPERATOR",pIdx->zName));
            sqlite3VdbeAddOp3(v, OP_OpenRead, iTab, pIdx->tnum, iDb);
            sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
            VdbeComment((v, "%s", pIdx->zName));
            assert( IN_INDEX_INDEX_DESC == IN_INDEX_INDEX_ASC+1 );
            eType = IN_INDEX_INDEX_ASC + pIdx->aSortOrder[0];

            if( prRhsHasNull ){
#ifdef SQLITE_ENABLE_COLUMN_USED_MASK
              i64 mask = (1<<nExpr)-1;
              sqlite3VdbeAddOp4Dup8(v, OP_ColumnsUsed,
                  iTab, 0, 0, (u8*)&mask, P4_INT64);
#endif
              *prRhsHasNull = ++pParse->nMem;
              if( nExpr==1 ){
                sqlite3SetHasNullFlag(v, iTab, *prRhsHasNull);
              }
            }
            sqlite3VdbeJumpHere(v, iAddr);
          }
        } /* End loop over indexes */
      } /* End if( affinity_ok ) */
    } /* End if not an rowid index */
  } /* End attempt to optimize using an index */

  /* If no preexisting index is available for the IN clause
  ** and IN_INDEX_NOOP is an allowed reply
  ** and the RHS of the IN operator is a list, not a subquery
  ** and the RHS is not constant or has two or fewer terms,
  ** then it is not worth creating an ephemeral table to evaluate
  ** the IN operator so return IN_INDEX_NOOP.
  */
  if( eType==0
   && (inFlags & IN_INDEX_NOOP_OK)
   && ExprUseXList(pX)
   && (!sqlite3InRhsIsConstant(pParse,pX) || pX->x.pList->nExpr<=2)
  ){
    pParse->nTab--;  /* Back out the allocation of the unused cursor */
    iTab = -1;       /* Cursor is not allocated */
    eType = IN_INDEX_NOOP;
  }

  if( eType==0 ){
    /* Could not find an existing table or index to use as the RHS b-tree.
    ** We will have to generate an ephemeral table to do the job.
    */
    u32 savedNQueryLoop = pParse->nQueryLoop;
    int rMayHaveNull = 0;
    eType = IN_INDEX_EPH;
    if( inFlags & IN_INDEX_LOOP ){
      pParse->nQueryLoop = 0;
    }else if( prRhsHasNull ){
      *prRhsHasNull = rMayHaveNull = ++pParse->nMem;
    }
    assert( pX->op==TK_IN );
    sqlite3CodeRhsOfIN(pParse, pX, iTab);
    if( rMayHaveNull ){
      sqlite3SetHasNullFlag(v, iTab, rMayHaveNull);
    }
    pParse->nQueryLoop = savedNQueryLoop;
  }

  if( aiMap && eType!=IN_INDEX_INDEX_ASC && eType!=IN_INDEX_INDEX_DESC ){
    int i, n;
    n = sqlite3ExprVectorSize(pX->pLeft);
    for(i=0; i<n; i++) aiMap[i] = i;
  }
  *piTab = iTab;
  return eType;
}